

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

OPJ_BOOL opj_jp2_read_ihdr(opj_jp2_t *jp2,OPJ_BYTE *p_image_header_data,
                          OPJ_UINT32 p_image_header_size,opj_event_mgr_t *p_manager)

{
  opj_j2k_t *poVar1;
  OPJ_UINT32 OVar2;
  opj_jp2_comps_t *poVar3;
  char *fmt;
  OPJ_BOOL OVar4;
  
  if (p_image_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_image_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x237,
                  "OPJ_BOOL opj_jp2_read_ihdr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x239,
                    "OPJ_BOOL opj_jp2_read_ihdr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    if (jp2->comps == (opj_jp2_comps_t *)0x0) {
      if (p_image_header_size == 0xe) {
        opj_read_bytes_LE(p_image_header_data,&jp2->h,4);
        opj_read_bytes_LE(p_image_header_data + 4,&jp2->w,4);
        opj_read_bytes_LE(p_image_header_data + 8,&jp2->numcomps,2);
        if (jp2->numcomps - 0x4001 < 0xffffc000) {
          fmt = "Invalid number of components (ihdr)\n";
        }
        else {
          poVar3 = (opj_jp2_comps_t *)opj_calloc((ulong)jp2->numcomps,0xc);
          jp2->comps = poVar3;
          if (poVar3 != (opj_jp2_comps_t *)0x0) {
            opj_read_bytes_LE(p_image_header_data + 10,&jp2->bpc,1);
            opj_read_bytes_LE(p_image_header_data + 0xb,&jp2->C,1);
            if (jp2->C != 7) {
              opj_event_msg(p_manager,4,
                            "JP2 IHDR box: compression type indicate that the file is not a conforming JP2 file (%d) \n"
                           );
            }
            opj_read_bytes_LE(p_image_header_data + 0xc,&jp2->UnkC,1);
            opj_read_bytes_LE(p_image_header_data + 0xd,&jp2->IPR,1);
            (jp2->j2k->m_cp).field_0x90 =
                 (jp2->j2k->m_cp).field_0x90 & 0xfb | (jp2->bpc == 0xff) << 2;
            poVar1 = jp2->j2k;
            OVar2 = jp2->h;
            poVar1->ihdr_w = jp2->w;
            poVar1->ihdr_h = OVar2;
            jp2->has_ihdr = '\x01';
            return 1;
          }
          fmt = "Not enough memory to handle image header (ihdr)\n";
        }
      }
      else {
        fmt = "Bad image header box (bad size)\n";
      }
      OVar4 = 0;
      opj_event_msg(p_manager,1,fmt);
    }
    else {
      opj_event_msg(p_manager,2,"Ignoring ihdr box. First ihdr box already read\n");
      OVar4 = 1;
    }
    return OVar4;
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x238,
                "OPJ_BOOL opj_jp2_read_ihdr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_ihdr(opj_jp2_t *jp2,
                                  OPJ_BYTE *p_image_header_data,
                                  OPJ_UINT32 p_image_header_size,
                                  opj_event_mgr_t * p_manager)
{
    /* preconditions */
    assert(p_image_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    if (jp2->comps != NULL) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Ignoring ihdr box. First ihdr box already read\n");
        return OPJ_TRUE;
    }

    if (p_image_header_size != 14) {
        opj_event_msg(p_manager, EVT_ERROR, "Bad image header box (bad size)\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_image_header_data, &(jp2->h), 4);          /* HEIGHT */
    p_image_header_data += 4;
    opj_read_bytes(p_image_header_data, &(jp2->w), 4);          /* WIDTH */
    p_image_header_data += 4;
    opj_read_bytes(p_image_header_data, &(jp2->numcomps), 2);   /* NC */
    p_image_header_data += 2;

    if ((jp2->numcomps - 1U) >=
            16384U) { /* unsigned underflow is well defined: 1U <= jp2->numcomps <= 16384U */
        opj_event_msg(p_manager, EVT_ERROR, "Invalid number of components (ihdr)\n");
        return OPJ_FALSE;
    }

    /* allocate memory for components */
    jp2->comps = (opj_jp2_comps_t*) opj_calloc(jp2->numcomps,
                 sizeof(opj_jp2_comps_t));
    if (jp2->comps == 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory to handle image header (ihdr)\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_image_header_data, &(jp2->bpc), 1);        /* BPC */
    ++ p_image_header_data;

    opj_read_bytes(p_image_header_data, &(jp2->C), 1);          /* C */
    ++ p_image_header_data;

    /* Should be equal to 7 cf. chapter about image header box of the norm */
    if (jp2->C != 7) {
        opj_event_msg(p_manager, EVT_INFO,
                      "JP2 IHDR box: compression type indicate that the file is not a conforming JP2 file (%d) \n",
                      jp2->C);
    }

    opj_read_bytes(p_image_header_data, &(jp2->UnkC), 1);       /* UnkC */
    ++ p_image_header_data;
    opj_read_bytes(p_image_header_data, &(jp2->IPR), 1);        /* IPR */
    ++ p_image_header_data;

    jp2->j2k->m_cp.allow_different_bit_depth_sign = (jp2->bpc == 255);
    jp2->j2k->ihdr_w = jp2->w;
    jp2->j2k->ihdr_h = jp2->h;
    jp2->has_ihdr = 1;

    return OPJ_TRUE;
}